

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnTry(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  
  RVar1 = PopAndCheckSignature(this,param_types,"try");
  PushLabel(this,Try,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnTry(const TypeVector& param_types,
                          const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "try");
  PushLabel(LabelType::Try, param_types, result_types);
  PushTypes(param_types);
  return result;
}